

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int get_lvalue(JSParseState *s,int *popcode,int *pscope,JSAtom *pname,int *plabel,int *pdepth,
              BOOL keep,int tok)

{
  JSFunctionDef *fd;
  uint8_t *puVar1;
  int iVar2;
  size_t sVar3;
  JSAtom name;
  uint8_t val;
  char *fmt;
  int iVar4;
  ushort uVar5;
  uint uVar6;
  ushort local_66;
  ushort local_64;
  ushort local_62;
  uint *local_60;
  JSAtom *local_58;
  uint *local_50;
  int *local_48;
  int *local_40;
  int local_38;
  int local_34;
  
  fd = s->cur_func;
  sVar3 = (size_t)fd->last_opcode_pos;
  name = 0;
  uVar6 = 0;
  if (-1 < (long)sVar3) {
    uVar6 = (uint)(fd->byte_code).buf[sVar3];
  }
  iVar4 = 2;
  if (uVar6 < 0x4a) {
    if (uVar6 == 0x41) {
      name = *(JSAtom *)((fd->byte_code).buf + sVar3 + 1);
      iVar4 = 1;
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      if (uVar6 != 0x47) goto LAB_00159f4b;
    }
  }
  else if (uVar6 == 0x4a) {
    uVar5 = 0;
    iVar4 = 3;
    name = 0;
  }
  else if (uVar6 == 0xbc) {
    puVar1 = (fd->byte_code).buf;
    name = *(JSAtom *)(puVar1 + sVar3 + 1);
    uVar5 = *(ushort *)(puVar1 + sVar3 + 5);
    iVar4 = 1;
  }
  else {
    if (uVar6 != 0xb6) {
LAB_00159f4b:
      if (tok == -0x45) {
        fmt = "invalid for in/of left hand-side";
      }
      else if ((tok & 0xfffffffeU) == 0xffffff94) {
        fmt = "invalid increment/decrement operand";
      }
      else if ((tok & 0xffffffdfU) == 0x5b) {
        fmt = "invalid destructuring target";
      }
      else {
        fmt = "invalid assignment left-hand side";
      }
LAB_00159ff4:
      js_parse_error(s,fmt);
      return -1;
    }
    puVar1 = (fd->byte_code).buf;
    name = *(JSAtom *)(puVar1 + sVar3 + 1);
    uVar5 = *(ushort *)(puVar1 + sVar3 + 5);
    if ((int)name < 0x4d) {
      if (name == 8) goto LAB_00159f4b;
      if (name == 0x3a) {
LAB_00159f2f:
        if ((fd->js_mode & 1) != 0) {
          fmt = "invalid lvalue in strict mode";
          goto LAB_00159ff4;
        }
        if ((name == 8) || (name == 0x71)) goto LAB_00159f4b;
      }
    }
    else {
      if (name == 0x71) goto LAB_00159f4b;
      if (name == 0x4d) goto LAB_00159f2f;
    }
  }
  (fd->byte_code).size = sVar3;
  fd->last_opcode_pos = -1;
  local_60 = (uint *)popcode;
  local_58 = pname;
  local_50 = (uint *)pscope;
  local_48 = pdepth;
  local_40 = plabel;
  if (keep == 0) {
    iVar2 = -1;
    if ((char)uVar6 == 'G') {
      emit_op(s,'q');
      uVar6 = 0x47;
    }
    else if (uVar6 == 0x4a) {
      emit_op(s,'p');
      uVar6 = 0x4a;
    }
    else if (uVar6 == 0xb6) {
      iVar2 = new_label_fd(fd,-1);
      emit_op(s,0xb9);
      emit_atom(s,name);
      local_34 = iVar2;
      dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_34,4);
      local_62 = uVar5;
      dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_62,2);
      fd->label_slots[iVar2].ref_count = fd->label_slots[iVar2].ref_count + 1;
      uVar6 = 0x3c;
    }
  }
  else {
    if (uVar6 < 0x4a) {
      if (uVar6 == 0x41) {
        emit_op(s,'B');
        emit_atom(s,name);
        iVar2 = -1;
        uVar6 = 0x41;
        goto LAB_00159f9e;
      }
      if (uVar6 != 0x47) {
LAB_0015a012:
        abort();
      }
      emit_op(s,'q');
      emit_op(s,'\x13');
      uVar6 = 0x47;
      val = 'G';
    }
    else {
      if (uVar6 != 0x4a) {
        if (uVar6 == 0xbc) {
          emit_op(s,0xbd);
          emit_atom(s,name);
          local_64 = uVar5;
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_64,2);
          iVar2 = -1;
          uVar6 = 0xbc;
        }
        else {
          if (uVar6 != 0xb6) goto LAB_0015a012;
          iVar2 = new_label_fd(fd,-1);
          emit_op(s,0xb9);
          emit_atom(s,name);
          local_38 = iVar2;
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_38,4);
          local_66 = uVar5;
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_66,2);
          fd->label_slots[iVar2].ref_count = fd->label_slots[iVar2].ref_count + 1;
          uVar6 = 0x3c;
          emit_op(s,'<');
        }
        goto LAB_00159f9e;
      }
      emit_op(s,'p');
      emit_op(s,'\x14');
      uVar6 = 0x4a;
      val = 'J';
    }
    emit_op(s,val);
    iVar2 = -1;
  }
LAB_00159f9e:
  *local_60 = uVar6;
  *local_50 = (uint)uVar5;
  *local_58 = name;
  *local_40 = iVar2;
  if (local_48 != (int *)0x0) {
    *local_48 = iVar4;
  }
  return 0;
}

Assistant:

static __exception int get_lvalue(JSParseState *s, int *popcode, int *pscope,
                                  JSAtom *pname, int *plabel, int *pdepth, BOOL keep,
                                  int tok)
{
    JSFunctionDef *fd;
    int opcode, scope, label, depth;
    JSAtom name;

    /* we check the last opcode to get the lvalue type */
    fd = s->cur_func;
    scope = 0;
    name = JS_ATOM_NULL;
    label = -1;
    depth = 0;
    switch(opcode = get_prev_opcode(fd)) {
    case OP_scope_get_var:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        scope = get_u16(fd->byte_code.buf + fd->last_opcode_pos + 5);
        if ((name == JS_ATOM_arguments || name == JS_ATOM_eval) &&
            (fd->js_mode & JS_MODE_STRICT)) {
            return js_parse_error(s, "invalid lvalue in strict mode");
        }
        if (name == JS_ATOM_this || name == JS_ATOM_new_target)
            goto invalid_lvalue;
        depth = 2;  /* will generate OP_get_ref_value */
        break;
    case OP_get_field:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        depth = 1;
        break;
    case OP_scope_get_private_field:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        scope = get_u16(fd->byte_code.buf + fd->last_opcode_pos + 5);
        depth = 1;
        break;
    case OP_get_array_el:
        depth = 2;
        break;
    case OP_get_super_value:
        depth = 3;
        break;
    default:
    invalid_lvalue:
        if (tok == TOK_FOR) {
            return js_parse_error(s, "invalid for in/of left hand-side");
        } else if (tok == TOK_INC || tok == TOK_DEC) {
            return js_parse_error(s, "invalid increment/decrement operand");
        } else if (tok == '[' || tok == '{') {
            return js_parse_error(s, "invalid destructuring target");
        } else {
            return js_parse_error(s, "invalid assignment left-hand side");
        }
    }
    /* remove the last opcode */
    fd->byte_code.size = fd->last_opcode_pos;
    fd->last_opcode_pos = -1;

    if (keep) {
        /* get the value but keep the object/fields on the stack */
        switch(opcode) {
        case OP_scope_get_var:
            label = new_label(s);
            emit_op(s, OP_scope_make_ref);
            emit_atom(s, name);
            emit_u32(s, label);
            emit_u16(s, scope);
            update_label(fd, label, 1);
            emit_op(s, OP_get_ref_value);
            opcode = OP_get_ref_value;
            break;
        case OP_get_field:
            emit_op(s, OP_get_field2);
            emit_atom(s, name);
            break;
        case OP_scope_get_private_field:
            emit_op(s, OP_scope_get_private_field2);
            emit_atom(s, name);
            emit_u16(s, scope);
            break;
        case OP_get_array_el:
            /* XXX: replace by a single opcode ? */
            emit_op(s, OP_to_propkey2);
            emit_op(s, OP_dup2);
            emit_op(s, OP_get_array_el);
            break;
        case OP_get_super_value:
            emit_op(s, OP_to_propkey);
            emit_op(s, OP_dup3);
            emit_op(s, OP_get_super_value);
            break;
        default:
            abort();
        }
    } else {
        switch(opcode) {
        case OP_scope_get_var:
            label = new_label(s);
            emit_op(s, OP_scope_make_ref);
            emit_atom(s, name);
            emit_u32(s, label);
            emit_u16(s, scope);
            update_label(fd, label, 1);
            opcode = OP_get_ref_value;
            break;
        case OP_get_array_el:
            emit_op(s, OP_to_propkey2);
            break;
        case OP_get_super_value:
            emit_op(s, OP_to_propkey);
            break;
        }
    }

    *popcode = opcode;
    *pscope = scope;
    /* name has refcount for OP_get_field and OP_get_ref_value,
       and JS_ATOM_NULL for other opcodes */
    *pname = name;
    *plabel = label;
    if (pdepth)
        *pdepth = depth;
    return 0;
}